

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O0

void __thiscall Http2::Frame::Frame(Frame *this)

{
  long lVar1;
  size_type in_RDI;
  long in_FS_OFFSET;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __a = (allocator_type *)&stack0xfffffffffffffff7;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x29ce73);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffff0,in_RDI,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x29ce90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Frame::Frame()
    : buffer(frameHeaderSize)
{
}